

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

uint32_t Image_Function::Sum(Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height)

{
  uint32_t uVar1;
  uchar *puVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint in_ECX;
  int in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  uint8_t *imageXEnd;
  uint8_t *imageX;
  uint32_t sum;
  uint8_t *imageYEnd;
  uint8_t *imageY;
  uint32_t rowSize;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint32_t uVar6;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (uint32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
             (uint32_t)in_stack_ffffffffffffffd8,
             (uint32_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
             (uint32_t)in_stack_ffffffffffffffd0);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in_stack_ffffffffffffffd0);
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((uint32_t *)in_stack_ffffffffffffffd0,
             (uint32_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             in_stack_ffffffffffffffc0);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
  puVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
  pbVar3 = puVar2 + (ulong)in_ESI + (ulong)(in_EDX * uVar1);
  pbVar4 = pbVar3 + in_R8D * uVar1;
  uVar6 = 0;
  for (; pbVar3 != pbVar4; pbVar3 = pbVar3 + uVar1) {
    for (pbVar5 = pbVar3; pbVar5 != pbVar3 + in_ECX; pbVar5 = pbVar5 + 1) {
      uVar6 = *pbVar5 + uVar6;
    }
  }
  return uVar6;
}

Assistant:

uint32_t Sum( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height )
    {
        ParameterValidation( image, x, y, width, height );
        VerifyGrayScaleImage( image );
        OptimiseRoi( width, height, image );

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageY    = image.data() + y * rowSize + x;
        const uint8_t * imageYEnd = imageY + height * rowSize;

        uint32_t sum = 0;

        for( ; imageY != imageYEnd; imageY += rowSize ) {
            const uint8_t * imageX    = imageY;
            const uint8_t * imageXEnd = imageX + width;

            for( ; imageX != imageXEnd; ++imageX )
                sum += (*imageX);
        }

        return sum;
    }